

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseMisc(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  xmlChar *pxVar2;
  
  xVar1 = ctxt->instate;
  do {
    if (xVar1 == XML_PARSER_EOF) {
      return;
    }
    xmlSkipBlankChars(ctxt);
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    pxVar2 = ctxt->input->cur;
    if (*pxVar2 != '<') {
      return;
    }
    if (pxVar2[1] == '?') {
      xmlParsePI(ctxt);
    }
    else {
      if (pxVar2[1] != '!') {
        return;
      }
      if (pxVar2[2] != '-') {
        return;
      }
      if (pxVar2[3] != '-') {
        return;
      }
      xmlParseComment(ctxt);
    }
    xVar1 = ctxt->instate;
  } while( true );
}

Assistant:

void
xmlParseMisc(xmlParserCtxtPtr ctxt) {
    while (ctxt->instate != XML_PARSER_EOF) {
        SKIP_BLANKS;
        GROW;
        if ((RAW == '<') && (NXT(1) == '?')) {
	    xmlParsePI(ctxt);
        } else if (CMP4(CUR_PTR, '<', '!', '-', '-')) {
	    xmlParseComment(ctxt);
        } else {
            break;
        }
    }
}